

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bxdfs.cpp
# Opt level: O0

string * __thiscall
pbrt::LayeredBxDF<pbrt::DielectricInterfaceBxDF,pbrt::ConductorBxDF>::ToString_abi_cxx11_
          (LayeredBxDF<pbrt::DielectricInterfaceBxDF,_pbrt::ConductorBxDF> *this)

{
  string *in_RDI;
  SampledSpectrum *in_stack_00000008;
  float *in_stack_00000010;
  DielectricInterfaceBxDF *in_stack_00000020;
  char *in_stack_00000028;
  float *in_stack_00000040;
  
  StringPrintf<pbrt::DielectricInterfaceBxDF_const&,pbrt::ConductorBxDF_const&,float_const&,pbrt::SampledSpectrum_const&,float_const&>
            (in_stack_00000028,in_stack_00000020,(ConductorBxDF *)this,in_stack_00000010,
             in_stack_00000008,in_stack_00000040);
  return in_RDI;
}

Assistant:

std::string LayeredBxDF<TopBxDF, BottomBxDF>::ToString() const {
    return StringPrintf(
        "[ LayeredBxDF top: %s bottom: %s thickness: %f albedo: %s g: %f ]", top, bottom,
        thickness, albedo, g);
}